

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

int doParseXmlDecl(_func_ENCODING_ptr_ENCODING_ptr_char_ptr_char_ptr *encodingFinder,
                  int isGeneralTextEntity,ENCODING *enc,char *ptr,char *end,char **badPtr,
                  char **versionPtr,char **versionEndPtr,char **encodingName,ENCODING **encoding,
                  int *standalone)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  ENCODING *pEVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  char *val;
  char *p;
  char local_79;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char **local_50;
  char *local_48;
  char *local_40;
  _func_ENCODING_ptr_ENCODING_ptr_char_ptr_char_ptr *local_38;
  
  local_58 = (char *)0x0;
  local_70 = (char *)0x0;
  local_60 = (char *)0x0;
  local_78 = ptr + (long)enc->minBytesPerChar * 5;
  local_68 = end + (long)enc->minBytesPerChar * -2;
  local_38 = encodingFinder;
  iVar3 = parsePseudoAttribute(enc,local_78,local_68,&local_70,&local_60,&local_58,&local_78);
  pcVar1 = local_70;
  pcVar6 = local_78;
  if (iVar3 == 0 || local_70 == (char *)0x0) goto LAB_004cdefe;
  iVar3 = (*enc->nameMatchesAscii)(enc,local_70,local_60,"version");
  if (iVar3 == 0) {
    pcVar6 = pcVar1;
    if (isGeneralTextEntity == 0) goto LAB_004cdefe;
  }
  else {
    if (versionPtr != (char **)0x0) {
      *versionPtr = local_58;
    }
    if (versionEndPtr != (char **)0x0) {
      *versionEndPtr = local_78;
    }
    iVar3 = parsePseudoAttribute(enc,local_78,local_68,&local_70,&local_60,&local_58,&local_78);
    pcVar6 = local_78;
    if (iVar3 == 0) goto LAB_004cdefe;
    if (local_70 == (char *)0x0) {
      if (isGeneralTextEntity == 0) {
        return 1;
      }
      goto LAB_004cdefe;
    }
  }
  iVar3 = (*enc->nameMatchesAscii)(enc,local_70,local_60,"encoding");
  pcVar1 = local_58;
  local_50 = badPtr;
  if (iVar3 != 0) {
    local_40 = local_58;
    local_48 = &local_79;
    (*enc->utf8Convert)(enc,&local_40,local_68,&local_48,(char *)&local_78);
    badPtr = local_50;
    if ((local_48 == &local_79) || (0x19 < ((int)local_79 & 0xffffffdfU) - 0x41)) {
      *local_50 = pcVar1;
LAB_004ce00b:
      bVar7 = false;
      iVar3 = 0;
    }
    else {
      if (encodingName != (char **)0x0) {
        *encodingName = pcVar1;
      }
      if (encoding != (ENCODING **)0x0) {
        pEVar4 = (*local_38)(enc,pcVar1,local_78 + -(long)enc->minBytesPerChar);
        *encoding = pEVar4;
      }
      iVar3 = parsePseudoAttribute(enc,local_78,local_68,&local_70,&local_60,&local_58,&local_78);
      if (iVar3 == 0) {
        *badPtr = local_78;
        goto LAB_004ce00b;
      }
      bVar7 = local_70 != (char *)0x0;
      iVar3 = 1;
    }
    if (!bVar7) {
      return iVar3;
    }
  }
  pcVar6 = local_70;
  iVar3 = (*enc->nameMatchesAscii)(enc,local_70,local_60,"standalone");
  pcVar2 = local_58;
  pcVar1 = local_78;
  if ((isGeneralTextEntity == 0) && (iVar3 != 0)) {
    iVar3 = (*enc->nameMatchesAscii)(enc,local_58,local_78 + -(long)enc->minBytesPerChar,"yes");
    if (iVar3 == 0) {
      iVar3 = (*enc->nameMatchesAscii)(enc,pcVar2,pcVar1 + -(long)enc->minBytesPerChar,"no");
      pcVar6 = pcVar2;
      if (iVar3 == 0) goto LAB_004cdefe;
      iVar3 = 0;
    }
    else {
      iVar3 = 1;
    }
    if (standalone != (int *)0x0) {
      *standalone = iVar3;
    }
    pcVar6 = local_78;
    while( true ) {
      local_48 = &local_79;
      local_40 = pcVar6;
      (*enc->utf8Convert)(enc,&local_40,local_68,&local_48,(char *)&local_78);
      uVar5 = (ulong)(uint)(int)local_79;
      if (local_48 == &local_79) {
        uVar5 = 0xffffffff;
      }
      if ((0x20 < (uint)uVar5) || ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0)) break;
      pcVar6 = pcVar6 + enc->minBytesPerChar;
    }
    badPtr = local_50;
    if (pcVar6 == local_68) {
      return 1;
    }
  }
LAB_004cdefe:
  *badPtr = pcVar6;
  return 0;
}

Assistant:

static
int doParseXmlDecl(const ENCODING *(*encodingFinder)(const ENCODING *,
                                                     const char *,
                                                     const char *),
                   int isGeneralTextEntity,
                   const ENCODING *enc,
                   const char *ptr,
                   const char *end,
                   const char **badPtr,
                   const char **versionPtr,
                   const char **versionEndPtr,
                   const char **encodingName,
                   const ENCODING **encoding,
                   int *standalone)
{
  const char *val = 0;
  const char *name = 0;
  const char *nameEnd = 0;
  ptr += 5 * enc->minBytesPerChar;
  end -= 2 * enc->minBytesPerChar;
  if (!parsePseudoAttribute(enc, ptr, end, &name, &nameEnd, &val, &ptr) || !name) {
    *badPtr = ptr;
    return 0;
  }
  if (!XmlNameMatchesAscii(enc, name, nameEnd, KW_version)) {
    if (!isGeneralTextEntity) {
      *badPtr = name;
      return 0;
    }
  }
  else {
    if (versionPtr)
      *versionPtr = val;
    if (versionEndPtr)
      *versionEndPtr = ptr;
    if (!parsePseudoAttribute(enc, ptr, end, &name, &nameEnd, &val, &ptr)) {
      *badPtr = ptr;
      return 0;
    }
    if (!name) {
      if (isGeneralTextEntity) {
        /* a TextDecl must have an EncodingDecl */
        *badPtr = ptr;
        return 0;
      }
      return 1;
    }
  }
  if (XmlNameMatchesAscii(enc, name, nameEnd, KW_encoding)) {
    int c = toAscii(enc, val, end);
    if (!(ASCII_a <= c && c <= ASCII_z) && !(ASCII_A <= c && c <= ASCII_Z)) {
      *badPtr = val;
      return 0;
    }
    if (encodingName)
      *encodingName = val;
    if (encoding)
      *encoding = encodingFinder(enc, val, ptr - enc->minBytesPerChar);
    if (!parsePseudoAttribute(enc, ptr, end, &name, &nameEnd, &val, &ptr)) {
      *badPtr = ptr;
      return 0;
    }
    if (!name)
      return 1;
  }
  if (!XmlNameMatchesAscii(enc, name, nameEnd, KW_standalone) || isGeneralTextEntity) {
    *badPtr = name;
    return 0;
  }
  if (XmlNameMatchesAscii(enc, val, ptr - enc->minBytesPerChar, KW_yes)) {
    if (standalone)
      *standalone = 1;
  }
  else if (XmlNameMatchesAscii(enc, val, ptr - enc->minBytesPerChar, KW_no)) {
    if (standalone)
      *standalone = 0;
  }
  else {
    *badPtr = val;
    return 0;
  }
  while (isSpace(toAscii(enc, ptr, end)))
    ptr += enc->minBytesPerChar;
  if (ptr != end) {
    *badPtr = ptr;
    return 0;
  }
  return 1;
}